

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::guess_value_type<std::vector<char,std::allocator<char>>>
          (result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  byte bVar1;
  
  bVar1 = **(byte **)(this + 0x40);
  if (bVar1 < 0x69) {
    if (bVar1 < 0x5b) {
      if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ.value = string;
        return __return_storage_ptr__;
      }
    }
    else {
      if (bVar1 == 0x5b) {
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ.value = array;
        return __return_storage_ptr__;
      }
      if (bVar1 == 0x66) {
LAB_00122ac8:
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ.value = boolean;
        return __return_storage_ptr__;
      }
    }
  }
  else if (bVar1 < 0x74) {
    if ((bVar1 == 0x69) || (bVar1 == 0x6e)) {
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value = floating;
      return __return_storage_ptr__;
    }
  }
  else {
    if (bVar1 == 0x74) goto LAB_00122ac8;
    if (bVar1 == 0x7b) {
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value = table;
      return __return_storage_ptr__;
    }
  }
  guess_number_type<std::vector<char,std::allocator<char>>>(__return_storage_ptr__,this,loc);
  return __return_storage_ptr__;
}

Assistant:

result<value_t, std::string> guess_value_type(const location<Container>& loc)
{
    switch(*loc.iter())
    {
        case '"' : {return ok(value_t::string);  }
        case '\'': {return ok(value_t::string);  }
        case 't' : {return ok(value_t::boolean); }
        case 'f' : {return ok(value_t::boolean); }
        case '[' : {return ok(value_t::array);   }
        case '{' : {return ok(value_t::table);   }
        case 'i' : {return ok(value_t::floating);} // inf.
        case 'n' : {return ok(value_t::floating);} // nan.
        default  : {return guess_number_type(loc);}
    }
}